

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCodes.h
# Opt level: O1

void jbcoin::RPC::inject_error<Json::Value>(error_code_i code,string *message,Value *json)

{
  ValueHolder VVar1;
  ushort uVar2;
  ErrorInfo *pEVar3;
  undefined4 extraout_var;
  ValueHolder *pVVar4;
  undefined4 extraout_var_00;
  ushort uVar5;
  ushort uVar6;
  ValueHolder local_40;
  ushort local_38;
  
  pEVar3 = get_error_info(code);
  uVar6 = local_38 & 0xfe00;
  local_38 = uVar6 + 0x104;
  Json::valueAllocator();
  local_40.int_ =
       (*Json::valueAllocator::valueAllocator->_vptr_ValueAllocator[4])
                 (Json::valueAllocator::valueAllocator,(pEVar3->token)._M_dataplus._M_p,
                  (ulong)(uint)(pEVar3->token)._M_string_length);
  local_40._4_4_ = extraout_var;
  pVVar4 = &Json::Value::resolveReference(json,"error",true)->value_;
  VVar1 = *pVVar4;
  *pVVar4 = local_40;
  uVar2 = *(ushort *)(pVVar4 + 1);
  pVVar4[1].bool_ = true;
  *(ushort *)(pVVar4 + 1) = uVar2 & 0xff04 | 0x104;
  local_38 = uVar2 & 0x100 | uVar6 | uVar2 & 0xff;
  local_40 = VVar1;
  Json::Value::~Value((Value *)&local_40);
  uVar6 = local_38;
  local_38 = CONCAT11(local_38._1_1_,1);
  local_40.int_ = pEVar3->code;
  pVVar4 = &Json::Value::resolveReference(json,"error_code",true)->value_;
  VVar1 = *pVVar4;
  *pVVar4 = local_40;
  uVar2 = *(ushort *)(pVVar4 + 1);
  uVar5 = (uVar2 & 0xff00) + 1;
  *(ushort *)(pVVar4 + 1) = uVar5;
  *(ushort *)(pVVar4 + 1) = uVar5 & 0xfe01 | uVar6 & 0x100;
  local_38 = uVar6 & 0xfe00 | uVar2 & 0xff | uVar2 & 0x100;
  local_40 = VVar1;
  Json::Value::~Value((Value *)&local_40);
  uVar6 = local_38 & 0xfe00;
  local_38 = uVar6 + 0x104;
  Json::valueAllocator();
  local_40.int_ =
       (*Json::valueAllocator::valueAllocator->_vptr_ValueAllocator[4])
                 (Json::valueAllocator::valueAllocator,(message->_M_dataplus)._M_p,
                  (ulong)(uint)message->_M_string_length);
  local_40._4_4_ = extraout_var_00;
  pVVar4 = &Json::Value::resolveReference(json,"error_message",true)->value_;
  VVar1 = *pVVar4;
  *pVVar4 = local_40;
  uVar2 = *(ushort *)(pVVar4 + 1);
  pVVar4[1].bool_ = true;
  *(ushort *)(pVVar4 + 1) = uVar2 & 0xff04 | 0x104;
  local_38 = uVar2 & 0x100 | uVar6 | uVar2 & 0xff;
  local_40 = VVar1;
  Json::Value::~Value((Value *)&local_40);
  return;
}

Assistant:

void inject_error (
    error_code_i code, std::string const& message, JsonValue& json)
{
    ErrorInfo const& info (get_error_info (code));
    json [jss::error] = info.token;
    json [jss::error_code] = info.code;
    json [jss::error_message] = message;
}